

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DestroyContext::DestroyContext
          (DestroyContext *this,SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *contex)

{
  SharedPtr<tcu::ThreadUtil::Object> local_38 [2];
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *local_18;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *contex_local;
  DestroyContext *this_local;
  
  local_18 = contex;
  contex_local = (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)this;
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"DestroyContext");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__DestroyContext_03277518;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_context,contex);
  de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>
            (local_38,&this->m_context);
  tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,local_38);
  de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(local_38);
  return;
}

Assistant:

DestroyContext::DestroyContext (SharedPtr<GLES2Context> contex)
	: tcu::ThreadUtil::Operation	("DestroyContext")
	, m_context					(contex)
{
	modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_context));
}